

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O1

ResultStats *
deqp::gls::anon_unknown_1::calculateStats
          (ResultStats *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values)

{
  pointer puVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedValues;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  __return_storage_ptr__->variance = 0.0;
  __return_storage_ptr__->min = 0;
  __return_storage_ptr__->median = 0.0;
  __return_storage_ptr__->mean = 0.0;
  __return_storage_ptr__->max = 0;
  __return_storage_ptr__->min = 0xffffffffffffffff;
  puVar1 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  uVar3 = (uint)((long)uVar8 >> 3);
  if ((int)uVar3 < 1) {
    dVar2 = 0.0;
  }
  else {
    uVar4 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + puVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
    auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    dVar2 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  }
  auVar12._8_4_ = (int)((long)uVar8 >> 0x23);
  auVar12._0_8_ = (long)uVar8 >> 3;
  auVar12._12_4_ = 0x45300000;
  dVar9 = (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0);
  dVar2 = dVar2 / dVar9;
  __return_storage_ptr__->mean = dVar2;
  if (0 < (int)uVar3) {
    dVar11 = __return_storage_ptr__->variance;
    uVar4 = 0;
    do {
      dVar13 = (((double)CONCAT44(0x45300000,(int)(puVar1[uVar4] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)puVar1[uVar4]) - 4503599627370496.0)) - dVar2;
      dVar11 = dVar11 + dVar13 * dVar13;
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
    __return_storage_ptr__->variance = dVar11;
  }
  __return_storage_ptr__->variance = __return_storage_ptr__->variance / dVar9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40,values);
  puVar1 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  __return_storage_ptr__->median =
       ((double)CONCAT44(0x45300000,
                         (int)(local_40.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[(int)(uVar8 >> 4)] >> 0x20))
       - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,
                         (int)local_40.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[(int)(uVar8 >> 4)]) -
       4503599627370496.0);
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  puVar1 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = __return_storage_ptr__->min;
  uVar3 = (uint)((ulong)((long)(values->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3);
  if (0 < (int)uVar3) {
    uVar7 = 0;
    uVar4 = __return_storage_ptr__->max;
    do {
      uVar5 = puVar1[uVar7];
      if (uVar5 < uVar8) {
        uVar8 = uVar5;
      }
      if (uVar5 < uVar4) {
        uVar5 = uVar4;
      }
      uVar7 = uVar7 + 1;
      uVar4 = uVar5;
    } while ((uVar3 & 0x7fffffff) != uVar7);
    __return_storage_ptr__->max = uVar5;
  }
  __return_storage_ptr__->min = uVar8;
  return __return_storage_ptr__;
}

Assistant:

ResultStats calculateStats (const vector<deUint64>& values)
{
	ResultStats result = { 0.0, 0.0, 0.0, 0xFFFFFFFFFFFFFFFFu, 0 };

	deUint64 sum = 0;

	for (int i = 0; i < (int)values.size(); i++)
		sum += values[i];

	result.mean = ((double)sum) / (double)values.size();

	for (int i = 0; i < (int)values.size(); i++)
	{
		const double val = (double)values[i];
		result.variance += (val - result.mean) * (val - result.mean);
	}

	result.variance /= (double)values.size();

	{
		const int n = (int)(values.size()/2);

		vector<deUint64> sortedValues = values;

		std::sort(sortedValues.begin(), sortedValues.end());

		result.median = (double)sortedValues[n];
	}

	for (int i = 0; i < (int)values.size(); i++)
	{
		result.min = std::min(result.min, values[i]);
		result.max = std::max(result.max, values[i]);
	}

	return result;
}